

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
asl::Array<asl::Array<asl::Var>_>::Array
          (Array<asl::Array<asl::Var>_> *this,Array<asl::Var> *p,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  alloc(this,n);
  uVar2 = 0;
  uVar1 = (ulong)(uint)n;
  if (n < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 8 != uVar2; uVar2 = uVar2 + 8) {
    Array<asl::Var>::operator=
              ((Array<asl::Var> *)((long)&this->_a->_a + uVar2),
               (Array<asl::Var> *)((long)&p->_a + uVar2));
  }
  return;
}

Assistant:

ASL_EXPLICIT Array(const T* p, int n) { alloc(n); for (int i = 0; i < n; i++) _a[i] = p[i]; }